

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR __thiscall NpyArray::SaveNPZ(NpyArray *this,string *zipname,string *varname,bool bAppend)

{
  char type;
  unsigned_short rhs;
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  uchar *puVar6;
  undefined1 local_160 [8];
  vector<char,_std::allocator<char>_> footer;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_120;
  char *local_118;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_110;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_108;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_100;
  const_iterator local_f8;
  string local_f0;
  undefined1 local_d0 [8];
  vector<char,_std::allocator<char>_> localHeader;
  uint uStack_b0;
  uint32_t crc;
  size_t nbytes;
  vector<char,_std::allocator<char>_> npyHeader;
  size_t res;
  LPCSTR ret;
  size_t globalHeaderSize;
  undefined1 local_60 [8];
  vector<char,_std::allocator<char>_> globalHeader;
  size_t globalHeaderOffset;
  FILE *pFStack_38;
  uint16_t nrecs;
  FILE *fp;
  string *psStack_28;
  bool bAppend_local;
  string *varname_local;
  string *zipname_local;
  NpyArray *this_local;
  
  globalHeaderOffset._6_2_ = 0;
  globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  fp._7_1_ = bAppend;
  psStack_28 = varname;
  varname_local = zipname;
  zipname_local = (string *)this;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_60);
  if ((fp._7_1_ & 1) == 0) {
LAB_001627b2:
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFStack_38 = fopen(pcVar3,"wb");
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFStack_38 = fopen(pcVar3,"r+b");
    if (pFStack_38 == (FILE *)0x0) goto LAB_001627b2;
    this_local = (NpyArray *)
                 ParseFooterZIP((FILE *)pFStack_38,(uint16_t *)((long)&globalHeaderOffset + 6),
                                (size_t *)&ret,
                                (size_t *)
                                &globalHeader.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.field_0x10);
    if (this_local != (NpyArray *)0x0) goto LAB_00162e9e;
    fseek(pFStack_38,globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,0);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_60,(size_type)ret);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_60);
    npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         fread(pcVar3,1,(size_t)ret,pFStack_38);
    if ((LPCSTR)npyHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ != ret) {
      this_local = (NpyArray *)anon_var_dwarf_275;
      goto LAB_00162e9e;
    }
    fseek(pFStack_38,globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,0);
  }
  if (pFStack_38 == (FILE *)0x0) {
    this_local = (NpyArray *)anon_var_dwarf_174;
  }
  else {
    type = this->type;
    if (type < '\x01') {
      type = -type;
    }
    CreateHeaderNPY((vector<char,_std::allocator<char>_> *)&nbytes,&this->shape,type,this->wordSize)
    ;
    sVar4 = SizeBytes(this);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)&nbytes);
    uStack_b0 = (int)sVar4 + (int)sVar5;
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)&nbytes);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)&nbytes);
    uVar1 = crc32(0,pcVar3,sVar5 & 0xffffffff);
    localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = uVar1;
    puVar6 = Data<unsigned_char>(this);
    sVar4 = SizeBytes(this);
    localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
         crc32(uVar1,puVar6,sVar4 & 0xffffffff);
    std::__cxx11::string::operator+=((string *)varname,".npy");
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_d0);
    add((vector<char,_std::allocator<char>_> *)local_d0,"PK");
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0x403);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0x14);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_d0,
                      localHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_d0,uStack_b0);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_d0,uStack_b0);
    rhs = std::__cxx11::string::size();
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,rhs);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_d0,0);
    std::__cxx11::string::string((string *)&local_f0,(string *)varname);
    add((vector<char,_std::allocator<char>_> *)local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    add((vector<char,_std::allocator<char>_> *)local_60,"PK");
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_60,0x201);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_60,0x14);
    local_100._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)local_60);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_f8,
               &local_100);
    local_110._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_d0);
    local_108 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                operator+(&local_110,4);
    local_120._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_d0);
    local_118 = (char *)__gnu_cxx::
                        __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                        operator+(&local_120,0x1e);
    std::vector<char,std::allocator<char>>::
    insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)local_60,local_f8,local_108,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_118);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_60,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_60,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_60,0);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_60,0);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_60,
                      globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    std::__cxx11::string::string
              ((string *)&footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
               (string *)varname);
    add((vector<char,_std::allocator<char>_> *)local_60,
        (string *)&footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    std::__cxx11::string::~string
              ((string *)&footer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
    ;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_160);
    add((vector<char,_std::allocator<char>_> *)local_160,"PK");
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_160,0x605);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_160,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_160,0);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_160,
                        globalHeaderOffset._6_2_ + 1);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_160,
                        globalHeaderOffset._6_2_ + 1);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_60);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_160,(uint)sVar5);
    iVar2 = globalHeader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + uStack_b0;
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_d0);
    add<unsigned_int>((vector<char,_std::allocator<char>_> *)local_160,iVar2 + (int)sVar5);
    add<unsigned_short>((vector<char,_std::allocator<char>_> *)local_160,0);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_d0);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_d0);
    fwrite(pcVar3,1,sVar5,pFStack_38);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)&nbytes);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)&nbytes);
    fwrite(pcVar3,1,sVar5,pFStack_38);
    puVar6 = Data<unsigned_char>(this);
    fwrite(puVar6,this->wordSize,this->numValues,pFStack_38);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_60);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_60);
    fwrite(pcVar3,1,sVar5,pFStack_38);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_160);
    sVar5 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_160);
    fwrite(pcVar3,1,sVar5,pFStack_38);
    fclose(pFStack_38);
    this_local = (NpyArray *)0x0;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_160);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_d0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&nbytes);
  }
LAB_00162e9e:
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_60)
  ;
  return (LPCSTR)this_local;
}

Assistant:

LPCSTR NpyArray::SaveNPZ(std::string zipname, std::string varname, bool bAppend) const
{
	FILE* fp;
	uint16_t nrecs = 0;
	size_t globalHeaderOffset = 0;
	std::vector<char> globalHeader;
	if (bAppend && (fp=fopen(zipname.c_str(), "r+b")) != NULL) {
		// zip file exists, add a new NPY array to it;
		// first read the footer and parse the offset and size of the global header
		// then read and store the global header;
		// the new data will be written at the start of the global header,
		// then append the global header and footer below it
		size_t globalHeaderSize;
		LPCSTR ret = ParseFooterZIP(fp, nrecs, globalHeaderSize, globalHeaderOffset);
		if (ret != NULL)
			return ret;
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
		globalHeader.resize(globalHeaderSize);
		size_t res = fread(globalHeader.data(), sizeof(char), globalHeaderSize, fp);
		if (res != globalHeaderSize)
			return "error: header read error while adding to existing zip";
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
	} else {
		fp = fopen(zipname.c_str(), "wb");
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> npyHeader = CreateHeaderNPY(shape, std::abs(type), wordSize);
	const size_t nbytes = SizeBytes() + npyHeader.size();

	// get the CRC of the data to be added
	uint32_t crc = crc32(0L, (uint8_t*)npyHeader.data(), (uLong)npyHeader.size());
	crc = crc32(crc, Data(), (uLong)SizeBytes());

	// append NPY extension
	varname += ".npy";

	// build the local header
	std::vector<char> localHeader;
	add(localHeader, "PK"); // first part of signature
	add(localHeader, (uint16_t)0x0403); // second part of signature
	add(localHeader, (uint16_t)20); // min version to extract
	add(localHeader, (uint16_t)0); // general purpose bit flag
	add(localHeader, (uint16_t)0); // compression method
	add(localHeader, (uint16_t)0); // file last mod time
	add(localHeader, (uint16_t)0); // file last mod date
	add(localHeader, (uint32_t)crc); // CRC
	add(localHeader, (uint32_t)nbytes); // compressed size
	add(localHeader, (uint32_t)nbytes); // uncompressed size
	add(localHeader, (uint16_t)varname.size()); // variable name length
	add(localHeader, (uint16_t)0); // extra field length
	add(localHeader, varname);

	// build global header
	add(globalHeader, "PK"); // first part of signature
	add(globalHeader, (uint16_t)0x0201); // second part of signature
	add(globalHeader, (uint16_t)20); // version made by
	globalHeader.insert(globalHeader.end(), localHeader.begin()+4, localHeader.begin()+30);
	add(globalHeader, (uint16_t)0); // file comment length
	add(globalHeader, (uint16_t)0); // disk number where file starts
	add(globalHeader, (uint16_t)0); // internal file attributes
	add(globalHeader, (uint32_t)0); // external file attributes
	add(globalHeader, (uint32_t)globalHeaderOffset); // relative offset of local file header, since it begins where the global header used to begin
	add(globalHeader, varname);

	// build footer
	std::vector<char> footer;
	add(footer, "PK"); // first part of signature
	add(footer, (uint16_t)0x0605); // second part of signature
	add(footer, (uint16_t)0); // number of this disk
	add(footer, (uint16_t)0); // disk where footer starts
	add(footer, (uint16_t)(nrecs+1)); // number of records on this disk
	add(footer, (uint16_t)(nrecs+1)); // total number of records
	add(footer, (uint32_t)globalHeader.size()); // number of bytes of global headers
	add(footer, (uint32_t)(globalHeaderOffset + nbytes + localHeader.size())); // offset of start of global headers, since global header now starts after newly written array
	add(footer, (uint16_t)0); // zip file comment length

	// write everything
	fwrite(localHeader.data(), sizeof(char), localHeader.size(), fp);
	fwrite(npyHeader.data(), sizeof(char), npyHeader.size(), fp);
	fwrite(Data(), wordSize, numValues, fp);
	fwrite(globalHeader.data(), sizeof(char), globalHeader.size(), fp);
	fwrite(footer.data(), sizeof(char), footer.size(), fp);
	fclose(fp);
	return NULL;
}